

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template-parser.c
# Opt level: O0

bc_slist_t * blogc_template_parse(char *src,size_t src_len,bc_error_t **err)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  _Bool _Var7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  bc_error_t *pbVar11;
  int local_b8;
  _Bool last;
  char c;
  int iStack_b4;
  _Bool block_open;
  blogc_template_node_type_t type;
  blogc_template_parser_state_t state;
  char *block_type;
  char *tmp;
  int *piStack_98;
  _Bool lstrip_next;
  blogc_template_node_t *previous;
  blogc_template_node_t *node;
  bc_slist_t *ast;
  _Bool block_foreach_open;
  _Bool foreach_open;
  ulong uStack_78;
  _Bool else_open;
  size_t block_if_count;
  size_t if_count;
  ulong uStack_60;
  blogc_template_operator_t tmp_op;
  size_t end2;
  size_t start2;
  size_t op_end;
  size_t op_start;
  size_t end;
  size_t start;
  size_t current;
  bc_error_t **err_local;
  size_t src_len_local;
  char *src_local;
  
  if ((err == (bc_error_t **)0x0) || (*err != (bc_error_t *)0x0)) {
    src_local = (char *)0x0;
  }
  else {
    end = 0;
    op_start = 0;
    op_end = 0;
    start2 = 0;
    end2 = 0;
    uStack_60 = 0;
    block_if_count = 0;
    uStack_78 = 0;
    bVar6 = false;
    bVar5 = false;
    bVar4 = false;
    node = (blogc_template_node_t *)0x0;
    piStack_98 = (int *)0x0;
    bVar2 = false;
    _type = 0;
    iStack_b4 = 1;
    local_b8 = 0xb;
    bVar3 = false;
    for (start = 0; start < src_len; start = start + 1) {
      cVar1 = src[start];
      switch(iStack_b4) {
      case 1:
        if (start == src_len - 1) {
          piStack_98 = (int *)bc_malloc(0x20);
          *piStack_98 = local_b8;
          if (bVar2) {
            pcVar9 = bc_strndup(src + end,src_len - end);
            pcVar10 = bc_str_lstrip(pcVar9);
            pcVar10 = bc_strdup(pcVar10);
            *(char **)(piStack_98 + 2) = pcVar10;
            free(pcVar9);
            bVar2 = false;
          }
          else {
            pcVar9 = bc_strndup(src + end,src_len - end);
            *(char **)(piStack_98 + 2) = pcVar9;
          }
          piStack_98[1] = 0;
          piStack_98[4] = 0;
          piStack_98[5] = 0;
          node = (blogc_template_node_t *)bc_slist_append((bc_slist_t *)node,piStack_98);
        }
        if (cVar1 == '{') {
          op_start = start;
          iStack_b4 = 2;
        }
        break;
      case 2:
        if ((cVar1 == '%') || (cVar1 == '{')) {
          if (cVar1 == '%') {
            iStack_b4 = 4;
          }
          else {
            iStack_b4 = 0x13;
          }
          if (end < op_start) {
            piStack_98 = (int *)bc_malloc(0x20);
            *piStack_98 = local_b8;
            if (bVar2) {
              pcVar9 = bc_strndup(src + end,op_start - end);
              pcVar10 = bc_str_lstrip(pcVar9);
              pcVar10 = bc_strdup(pcVar10);
              *(char **)(piStack_98 + 2) = pcVar10;
              free(pcVar9);
              bVar2 = false;
            }
            else {
              pcVar9 = bc_strndup(src + end,op_start - end);
              *(char **)(piStack_98 + 2) = pcVar9;
            }
            piStack_98[1] = 0;
            piStack_98[4] = 0;
            piStack_98[5] = 0;
            node = (blogc_template_node_t *)bc_slist_append((bc_slist_t *)node,piStack_98);
          }
        }
        else {
          iStack_b4 = 1;
        }
        break;
      case 3:
switchD_00105089_caseD_3:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if ((cVar1 < 'a') || ('z' < cVar1)) {
            if (cVar1 == '-') {
              pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                        "Invalid statement syntax. Duplicated whitespace cleaner before statement."
                                       );
              *err = pbVar11;
            }
            else {
              pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                        "Invalid statement syntax. Must begin with lowercase letter."
                                       );
              *err = pbVar11;
            }
          }
          else {
            iStack_b4 = 5;
            end = start;
          }
        }
        break;
      case 4:
        if (cVar1 != '-') {
          iStack_b4 = 3;
          goto switchD_00105089_caseD_3;
        }
        if ((piStack_98 != (int *)0x0) && (*piStack_98 == 0xb)) {
          pcVar9 = bc_str_rstrip(*(char **)(piStack_98 + 2));
          *(char **)(piStack_98 + 2) = pcVar9;
        }
        iStack_b4 = 3;
        break;
      case 5:
        if ((cVar1 < 'a') || ('z' < cVar1)) {
          _Var7 = bc_isspace((int)cVar1);
          if (_Var7) {
            if ((start - end == 5) && (iVar8 = strncmp("block",src + end,5), iVar8 == 0)) {
              if (bVar3) {
                pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                          "Blocks can\'t be nested.");
                *err = pbVar11;
              }
              else {
                iStack_b4 = 6;
                local_b8 = 8;
                end = start;
                uStack_78 = block_if_count;
                bVar4 = bVar5;
              }
            }
            else if ((start - end == 8) && (iVar8 = strncmp("endblock",src + end,8), iVar8 == 0)) {
              if (bVar3) {
                if (block_if_count == uStack_78) {
                  if ((bVar4) || (!bVar5)) {
                    iStack_b4 = 0x11;
                    local_b8 = 9;
                    bVar3 = false;
                  }
                  else {
                    pbVar11 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                                  "An open \'foreach\' statement was not closed inside a \'%s\' block!"
                                                  ,_type);
                    *err = pbVar11;
                  }
                }
                else {
                  pbVar11 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                                "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed inside a \'%s\' block!"
                                                ,block_if_count - uStack_78,_type);
                  *err = pbVar11;
                }
              }
              else {
                pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                          "\'endblock\' statement without an open \'block\' statement."
                                         );
                *err = pbVar11;
              }
            }
            else if ((start - end == 5) && (iVar8 = strncmp("ifdef",src + end,5), iVar8 == 0)) {
              iStack_b4 = 8;
              local_b8 = 1;
              end = start;
              block_if_count = block_if_count + 1;
              bVar6 = false;
            }
            else if ((start - end == 6) && (iVar8 = strncmp("ifndef",src + end,6), iVar8 == 0)) {
              iStack_b4 = 8;
              local_b8 = 2;
              end = start;
              block_if_count = block_if_count + 1;
              bVar6 = false;
            }
            else if ((start - end == 2) && (iVar8 = strncmp("if",src + end,2), iVar8 == 0)) {
              iStack_b4 = 8;
              local_b8 = 3;
              end = start;
              block_if_count = block_if_count + 1;
              bVar6 = false;
            }
            else if ((start - end == 4) && (iVar8 = strncmp("else",src + end,4), iVar8 == 0)) {
              if (((bVar3) && (uStack_78 < block_if_count)) || ((!bVar3 && (block_if_count != 0))))
              {
                if (bVar6) {
                  pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                            "More than one \'else\' statement for an open \'if\', \'ifdef\' or \'ifndef\' statement."
                                           );
                  *err = pbVar11;
                }
                else {
                  iStack_b4 = 0x11;
                  local_b8 = 4;
                  bVar6 = true;
                }
              }
              else {
                pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                          "\'else\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement."
                                         );
                *err = pbVar11;
              }
            }
            else if ((start - end == 5) && (iVar8 = strncmp("endif",src + end,5), iVar8 == 0)) {
              if (((bVar3) && (uStack_78 < block_if_count)) || ((!bVar3 && (block_if_count != 0))))
              {
                iStack_b4 = 0x11;
                local_b8 = 5;
                block_if_count = block_if_count - 1;
                bVar6 = false;
              }
              else {
                pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                          "\'endif\' statement without an open \'if\', \'ifdef\' or \'ifndef\' statement."
                                         );
                *err = pbVar11;
              }
            }
            else if ((start - end == 7) && (iVar8 = strncmp("foreach",src + end,7), iVar8 == 0)) {
              if (bVar5) {
                pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                          "\'foreach\' statements can\'t be nested.");
                *err = pbVar11;
              }
              else {
                iStack_b4 = 0xf;
                local_b8 = 6;
                end = start;
                bVar5 = true;
              }
            }
            else {
              if ((start - end != 10) || (iVar8 = strncmp("endforeach",src + end,10), iVar8 != 0))
              goto LAB_001059bb;
              if (((bVar3) && ((!bVar4 && (bVar5)))) || ((!bVar3 && (bVar5)))) {
                iStack_b4 = 0x11;
                local_b8 = 7;
                bVar5 = false;
              }
              else {
                pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                          "\'endforeach\' statement without an open \'foreach\' statement."
                                         );
                *err = pbVar11;
              }
            }
          }
          else {
LAB_001059bb:
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid statement type: Allowed types are: \'block\', \'endblock\', \'if\', \'ifdef\', \'ifndef\', \'else\', \'endif\', \'foreach\' and \'endforeach\'."
                                     );
            *err = pbVar11;
          }
        }
        break;
      case 6:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if ((cVar1 < 'a') || ('z' < cVar1)) {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid block syntax. Must begin with lowercase letter.");
            *err = pbVar11;
          }
          else {
            iStack_b4 = 7;
            end = start;
          }
        }
        break;
      case 7:
        if (((cVar1 < 'a') || ('z' < cVar1)) && (cVar1 != '_')) {
          _Var7 = bc_isspace((int)cVar1);
          if (_Var7) {
            if ((start - end == 5) && (iVar8 = strncmp("entry",src + end,5), iVar8 == 0)) {
              bVar3 = true;
              op_start = start;
              iStack_b4 = 0x11;
            }
            else if ((start - end == 7) && (iVar8 = strncmp("listing",src + end,7), iVar8 == 0)) {
              bVar3 = true;
              op_start = start;
              iStack_b4 = 0x11;
            }
            else if ((start - end == 0xc) &&
                    (iVar8 = strncmp("listing_once",src + end,0xc), iVar8 == 0)) {
              bVar3 = true;
              op_start = start;
              iStack_b4 = 0x11;
            }
            else if ((start - end == 0xd) &&
                    (iVar8 = strncmp("listing_empty",src + end,0xd), iVar8 == 0)) {
              bVar3 = true;
              op_start = start;
              iStack_b4 = 0x11;
            }
            else {
              if ((start - end != 0xd) ||
                 (iVar8 = strncmp("listing_entry",src + end,0xd), iVar8 != 0)) goto LAB_00105c26;
              bVar3 = true;
              op_start = start;
              iStack_b4 = 0x11;
            }
          }
          else {
LAB_00105c26:
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid block type. Allowed types are: \'entry\', \'listing\', \'listing_once\', \'listing_empty\' and \'listing_entry\'."
                                     );
            *err = pbVar11;
          }
        }
        break;
      case 8:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if ((cVar1 < 'A') || ('Z' < cVar1)) {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid variable name. Must begin with uppercase letter.");
            *err = pbVar11;
          }
          else {
            iStack_b4 = 9;
            end = start;
          }
        }
        break;
      case 9:
        if ((((cVar1 < 'A') || ('Z' < cVar1)) && ((cVar1 < '0' || ('9' < cVar1)))) && (cVar1 != '_')
           ) {
          _Var7 = bc_isspace((int)cVar1);
          if (_Var7) {
            op_start = start;
            if (local_b8 == 3) {
              iStack_b4 = 10;
            }
            else {
              iStack_b4 = 0x11;
            }
          }
          else {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid variable name. Must be uppercase letter, number or \'_\'."
                                     );
            *err = pbVar11;
          }
        }
        break;
      case 10:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          iStack_b4 = 0xb;
          op_end = start;
        }
        break;
      case 0xb:
        _Var7 = bc_isspace((int)cVar1);
        if (_Var7) {
          iStack_b4 = 0xc;
          start2 = start;
        }
        break;
      case 0xc:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if ((cVar1 < 'A') || ('Z' < cVar1)) {
            if (cVar1 == '\"') {
              iStack_b4 = 0xd;
              end2 = start;
            }
            else {
              op_end = 0;
              start2 = 0;
              pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                        "Invalid \'if\' operand. Must be double-quoted static string or variable."
                                       );
              *err = pbVar11;
            }
          }
          else {
            iStack_b4 = 0xe;
            end2 = start;
          }
        }
        break;
      case 0xd:
        if ((cVar1 == '\"') && (src[start - 1] != '\\')) {
          iStack_b4 = 0x11;
          uStack_60 = start + 1;
        }
        break;
      case 0xe:
        if ((((cVar1 < 'A') || ('Z' < cVar1)) && ((cVar1 < '0' || ('9' < cVar1)))) && (cVar1 != '_')
           ) {
          iStack_b4 = 0x11;
          uStack_60 = start;
        }
        break;
      case 0xf:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if ((cVar1 < 'A') || ('Z' < cVar1)) {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid foreach variable name. Must begin with uppercase letter."
                                     );
            *err = pbVar11;
          }
          else {
            iStack_b4 = 0x10;
            end = start;
          }
        }
        break;
      case 0x10:
        if ((((cVar1 < 'A') || ('Z' < cVar1)) && ((cVar1 < '0' || ('9' < cVar1)))) && (cVar1 != '_')
           ) {
          _Var7 = bc_isspace((int)cVar1);
          if (_Var7) {
            op_start = start;
            iStack_b4 = 0x11;
          }
          else {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid foreach variable name. Must be uppercase letter, number or \'_\'."
                                     );
            *err = pbVar11;
          }
        }
        break;
      case 0x11:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if (cVar1 != '-') {
            iStack_b4 = 0x12;
            goto switchD_00105089_caseD_12;
          }
          bVar2 = true;
          iStack_b4 = 0x12;
        }
        break;
      case 0x12:
switchD_00105089_caseD_12:
        if (cVar1 == '%') {
          iStack_b4 = 0x16;
        }
        else if (cVar1 == '-') {
          pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                    "Invalid statement syntax. Duplicated whitespace cleaner after statement."
                                   );
          *err = pbVar11;
        }
        else {
          pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                    "Invalid statement syntax. Must end with \'%%}\'.");
          *err = pbVar11;
        }
        break;
      case 0x13:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if ((cVar1 < 'A') || ('Z' < cVar1)) {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid variable name. Must begin with uppercase letter.");
            *err = pbVar11;
          }
          else {
            iStack_b4 = 0x14;
            local_b8 = 10;
            end = start;
          }
        }
        break;
      case 0x14:
        if ((((cVar1 < 'A') || ('Z' < cVar1)) && ((cVar1 < '0' || ('9' < cVar1)))) && (cVar1 != '_')
           ) {
          _Var7 = bc_isspace((int)cVar1);
          if (_Var7) {
            op_start = start;
            iStack_b4 = 0x15;
          }
          else if (cVar1 == '}') {
            op_start = start;
            iStack_b4 = 0x16;
          }
          else {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid variable name. Must be uppercase letter, number or \'_\'."
                                     );
            *err = pbVar11;
          }
        }
        break;
      case 0x15:
        _Var7 = bc_isspace((int)cVar1);
        if (!_Var7) {
          if (cVar1 == '}') {
            iStack_b4 = 0x16;
          }
          else {
            pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                      "Invalid statement syntax. Must end with \'}}\'.");
            *err = pbVar11;
          }
        }
        break;
      case 0x16:
        if (cVar1 == '}') {
          if_count._4_4_ = 0;
          if (op_end < start2) {
            if (start2 - op_end == 1) {
              iVar8 = strncmp("<",src + op_end,1);
              if (iVar8 == 0) {
                if_count._4_4_ = 4;
              }
              else {
                iVar8 = strncmp(">",src + op_end,1);
                if (iVar8 == 0) {
                  if_count._4_4_ = 8;
                }
              }
            }
            else if (start2 - op_end == 2) {
              iVar8 = strncmp("<=",src + op_end,2);
              if (iVar8 == 0) {
                if_count._4_4_ = 6;
              }
              else {
                iVar8 = strncmp(">=",src + op_end,2);
                if (iVar8 == 0) {
                  if_count._4_4_ = 10;
                }
                else {
                  iVar8 = strncmp("==",src + op_end,2);
                  if (iVar8 == 0) {
                    if_count._4_4_ = 2;
                  }
                  else {
                    iVar8 = strncmp("!=",src + op_end,2);
                    if_count._4_4_ = (uint)(iVar8 == 0);
                  }
                }
              }
            }
            if (if_count._4_4_ == 0) {
              pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,op_end,
                                        "Invalid \'if\' operator. Must be \'<\', \'>\', \'<=\', \'>=\', \'==\' or \'!=\'."
                                       );
              *err = pbVar11;
              op_end = 0;
              start2 = 0;
              break;
            }
            op_end = 0;
            start2 = 0;
          }
          piStack_98 = (int *)bc_malloc(0x20);
          *piStack_98 = local_b8;
          piStack_98[1] = if_count._4_4_;
          piStack_98[2] = 0;
          piStack_98[3] = 0;
          piStack_98[4] = 0;
          piStack_98[5] = 0;
          if (end < op_start) {
            pcVar9 = bc_strndup(src + end,op_start - end);
            *(char **)(piStack_98 + 2) = pcVar9;
          }
          if (end2 < uStack_60) {
            pcVar9 = bc_strndup(src + end2,uStack_60 - end2);
            *(char **)(piStack_98 + 4) = pcVar9;
            end2 = 0;
            uStack_60 = 0;
          }
          if (local_b8 == 8) {
            _type = *(undefined8 *)(piStack_98 + 2);
          }
          node = (blogc_template_node_t *)bc_slist_append((bc_slist_t *)node,piStack_98);
          iStack_b4 = 1;
          local_b8 = 0xb;
          end = start + 1;
        }
        else {
          pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,start,
                                    "Invalid statement syntax. Must end with \'}\'.");
          *err = pbVar11;
        }
      }
      if (*err != (bc_error_t *)0x0) break;
    }
    if (*err == (bc_error_t *)0x0) {
      if (iStack_b4 == 0xd) {
        pbVar11 = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,src,src_len,end2,
                                  "Found an open double-quoted string.");
        *err = pbVar11;
      }
      else if (block_if_count == 0) {
        if (bVar3) {
          pbVar11 = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,"An open block was not closed!");
          *err = pbVar11;
        }
        else if (bVar5) {
          pbVar11 = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                                 "An open \'foreach\' statement was not closed!");
          *err = pbVar11;
        }
      }
      else {
        pbVar11 = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                      "%d open \'if\', \'ifdef\' and/or \'ifndef\' statements were not closed!"
                                      ,block_if_count);
        *err = pbVar11;
      }
    }
    if (*err == (bc_error_t *)0x0) {
      src_local = (char *)node;
    }
    else {
      blogc_template_free_ast((bc_slist_t *)node);
      src_local = (char *)0x0;
    }
  }
  return (bc_slist_t *)src_local;
}

Assistant:

bc_slist_t*
blogc_template_parse(const char *src, size_t src_len, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end = 0;
    size_t op_start = 0;
    size_t op_end = 0;
    size_t start2 = 0;
    size_t end2 = 0;

    blogc_template_operator_t tmp_op = 0;

    size_t if_count = 0;
    size_t block_if_count = 0;
    bool else_open = false;
    bool foreach_open = false;
    bool block_foreach_open = false;

    bc_slist_t *ast = NULL;
    blogc_template_node_t *node = NULL;

    /*
     * this is a reference to the content of previous node in the singly-linked
     * list. The "correct" solution here would be implement a doubly-linked
     * list, but here are a few reasons to avoid it:
     *
     * - i'm too tired to implement it :P
     * - template parser never walk backwards, then the list itself does not
     *   need to know its previous node.
     */
    blogc_template_node_t *previous = NULL;

    bool lstrip_next = false;
    char *tmp = NULL;
    char *block_type = NULL;

    blogc_template_parser_state_t state = TEMPLATE_START;
    blogc_template_node_type_t type = BLOGC_TEMPLATE_NODE_CONTENT;

    bool block_open = false;

    while (current < src_len) {
        char c = src[current];
        bool last = current == src_len - 1;

        switch (state) {

            case TEMPLATE_START:
                if (last) {
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    if (lstrip_next) {
                        tmp = bc_strndup(src + start, src_len - start);
                        node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                        free(tmp);
                        tmp = NULL;
                        lstrip_next = false;
                    }
                    else {
                        node->data[0] = bc_strndup(src + start, src_len - start);
                    }
                    node->op = 0;
                    node->data[1] = NULL;
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                }
                if (c == '{') {
                    end = current;
                    state = TEMPLATE_OPEN_BRACKET;
                }
                break;

            case TEMPLATE_OPEN_BRACKET:
                if (c == '%' || c == '{') {
                    if (c == '%')
                        state = TEMPLATE_BLOCK_START_WHITESPACE_CLEANER;
                    else
                        state = TEMPLATE_VARIABLE_START;
                    if (end > start) {
                        node = bc_malloc(sizeof(blogc_template_node_t));
                        node->type = type;
                        if (lstrip_next) {
                            tmp = bc_strndup(src + start, end - start);
                            node->data[0] = bc_strdup(bc_str_lstrip(tmp));
                            free(tmp);
                            tmp = NULL;
                            lstrip_next = false;
                        }
                        else {
                            node->data[0] = bc_strndup(src + start, end - start);
                        }
                        node->op = 0;
                        node->data[1] = NULL;
                        ast = bc_slist_append(ast, node);
                        previous = node;
                        node = NULL;
                    }
                    break;
                }
                state = TEMPLATE_START;
                break;

            case TEMPLATE_BLOCK_START_WHITESPACE_CLEANER:
                if (c == '-') {
                    if ((previous != NULL) &&
                        (previous->type == BLOGC_TEMPLATE_NODE_CONTENT))
                    {
                        previous->data[0] = bc_str_rstrip(previous->data[0]);  // does not need copy
                    }
                    state = TEMPLATE_BLOCK_START;
                    break;
                }
                state = TEMPLATE_BLOCK_START;

            case TEMPLATE_BLOCK_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_TYPE;
                    start = current;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner before statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_TYPE:
                if (c >= 'a' && c <= 'z')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("block", src + start, 5)))
                    {
                        if (!block_open) {
                            state = TEMPLATE_BLOCK_BLOCK_TYPE_START;
                            type = BLOGC_TEMPLATE_NODE_BLOCK;
                            start = current;
                            block_if_count = if_count;
                            block_foreach_open = foreach_open;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "Blocks can't be nested.");
                        break;
                    }
                    else if ((current - start == 8) &&
                        (0 == strncmp("endblock", src + start, 8)))
                    {
                        if (block_open) {
                            if (if_count != block_if_count) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "%d open 'if', 'ifdef' and/or 'ifndef' statements "
                                    "were not closed inside a '%s' block!",
                                    if_count - block_if_count, block_type);
                                break;
                            }
                            if (!block_foreach_open && foreach_open) {
                                *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                                    "An open 'foreach' statement was not closed "
                                    "inside a '%s' block!", block_type);
                                break;
                            }
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDBLOCK;
                            block_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endblock' statement without an open 'block' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("ifdef", src + start, 5)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 6) &&
                        (0 == strncmp("ifndef", src + start, 6)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IFNDEF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 2) &&
                        (0 == strncmp("if", src + start, 2)))
                    {
                        state = TEMPLATE_BLOCK_IF_START;
                        type = BLOGC_TEMPLATE_NODE_IF;
                        start = current;
                        if_count++;
                        else_open = false;
                        break;
                    }
                    else if ((current - start == 4) &&
                        (0 == strncmp("else", src + start, 4)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            if (!else_open) {
                                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                                type = BLOGC_TEMPLATE_NODE_ELSE;
                                else_open = true;
                                break;
                            }
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, current,
                                "More than one 'else' statement for an open 'if', "
                                "'ifdef' or 'ifndef' statement.");
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'else' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 5) &&
                        (0 == strncmp("endif", src + start, 5)))
                    {
                        if ((block_open && if_count > block_if_count) ||
                            (!block_open && if_count > 0))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDIF;
                            if_count--;
                            else_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endif' statement without an open 'if', 'ifdef' or "
                            "'ifndef' statement.");
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("foreach", src + start, 7)))
                    {
                        if (!foreach_open) {
                            state = TEMPLATE_BLOCK_FOREACH_START;
                            type = BLOGC_TEMPLATE_NODE_FOREACH;
                            start = current;
                            foreach_open = true;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current, "'foreach' statements can't "
                            "be nested.");
                        break;
                    }
                    else if ((current - start == 10) &&
                        (0 == strncmp("endforeach", src + start, 10)))
                    {
                        if ((block_open && !block_foreach_open && foreach_open) ||
                            (!block_open && foreach_open))
                        {
                            state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                            type = BLOGC_TEMPLATE_NODE_ENDFOREACH;
                            foreach_open = false;
                            break;
                        }
                        *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                            src, src_len, current,
                            "'endforeach' statement without an open 'foreach' "
                            "statement.");
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement type: Allowed types are: 'block', "
                    "'endblock', 'if', 'ifdef', 'ifndef', 'else', 'endif', "
                    "'foreach' and 'endforeach'.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'a' && c <= 'z') {
                    state = TEMPLATE_BLOCK_BLOCK_TYPE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block syntax. Must begin with lowercase letter.");
                break;

            case TEMPLATE_BLOCK_BLOCK_TYPE:
                if ((c >= 'a' && c <= 'z') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    if ((current - start == 5) &&
                        (0 == strncmp("entry", src + start, 5)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 7) &&
                        (0 == strncmp("listing", src + start, 7)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 12) &&
                        (0 == strncmp("listing_once", src + start, 12)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_empty", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                    else if ((current - start == 13) &&
                        (0 == strncmp("listing_entry", src + start, 13)))
                    {
                        block_open = true;
                        end = current;
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                        break;
                    }
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid block type. Allowed types are: 'entry', 'listing', "
                    "'listing_once', 'listing_empty' and 'listing_entry'.");
                break;

            case TEMPLATE_BLOCK_IF_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_BLOCK_IF_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    if (type == BLOGC_TEMPLATE_NODE_IF)
                        state = TEMPLATE_BLOCK_IF_OPERATOR_START;
                    else
                        state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR_START:
                if (bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERATOR;
                op_start = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERATOR:
                if (!bc_isspace(c))
                    break;
                state = TEMPLATE_BLOCK_IF_OPERAND_START;
                op_end = current;
                break;

            case TEMPLATE_BLOCK_IF_OPERAND_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_IF_VARIABLE_OPERAND;
                    start2 = current;
                    break;
                }
                if (c == '"') {
                    state = TEMPLATE_BLOCK_IF_STRING_OPERAND;
                    start2 = current;
                    break;
                }
                op_start = 0;
                op_end = 0;
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid 'if' operand. Must be double-quoted static "
                    "string or variable.");
                break;

            case TEMPLATE_BLOCK_IF_STRING_OPERAND:
                if (c != '"')
                    break;
                if (c == '"' && src[current - 1] == '\\')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current + 1;
                break;

           case TEMPLATE_BLOCK_IF_VARIABLE_OPERAND:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                end2 = current;
                break;

            case TEMPLATE_BLOCK_FOREACH_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_BLOCK_FOREACH_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must begin with uppercase "
                    "letter.");
                break;

            case TEMPLATE_BLOCK_FOREACH_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_BLOCK_END_WHITESPACE_CLEANER;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid foreach variable name. Must be uppercase letter, "
                    "number or '_'.");
                break;

            case TEMPLATE_BLOCK_END_WHITESPACE_CLEANER:
                if (bc_isspace(c))
                    break;
                if (c == '-') {
                    lstrip_next = true;
                    state = TEMPLATE_BLOCK_END;
                    break;
                }
                state = TEMPLATE_BLOCK_END;

            case TEMPLATE_BLOCK_END:
                if (c == '%') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                if (c == '-') {
                    *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                        src_len, current,
                        "Invalid statement syntax. Duplicated whitespace "
                        "cleaner after statement.");
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '%%}'.");
                break;

            case TEMPLATE_VARIABLE_START:
                if (bc_isspace(c))
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = TEMPLATE_VARIABLE;
                    type = BLOGC_TEMPLATE_NODE_VARIABLE;
                    start = current;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must begin with uppercase letter.");
                break;

            case TEMPLATE_VARIABLE:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (bc_isspace(c)) {
                    end = current;
                    state = TEMPLATE_VARIABLE_END;
                    break;
                }
                if (c == '}') {
                    end = current;
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid variable name. Must be uppercase letter, number "
                    "or '_'.");
                break;

            case TEMPLATE_VARIABLE_END:
                if (bc_isspace(c))
                    break;
                if (c == '}') {
                    state = TEMPLATE_CLOSE_BRACKET;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}}'.");
                break;

            case TEMPLATE_CLOSE_BRACKET:
                if (c == '}') {
                    tmp_op = 0;
                    if (op_end > op_start) {
                        if (op_end - op_start == 1) {
                            if (0 == strncmp("<", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_LT;
                            else if (0 == strncmp(">", src + op_start, 1))
                                tmp_op = BLOGC_TEMPLATE_OP_GT;
                        }
                        else if (op_end - op_start == 2) {
                            if (0 == strncmp("<=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_LT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp(">=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_GT | BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("==", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_EQ;
                            else if (0 == strncmp("!=", src + op_start, 2))
                                tmp_op = BLOGC_TEMPLATE_OP_NEQ;
                        }
                        if (tmp_op == 0) {
                            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER,
                                src, src_len, op_start,
                                "Invalid 'if' operator. Must be '<', '>', "
                                "'<=', '>=', '==' or '!='.");
                            op_start = 0;
                            op_end = 0;
                            break;
                        }
                        op_start = 0;
                        op_end = 0;
                    }
                    node = bc_malloc(sizeof(blogc_template_node_t));
                    node->type = type;
                    node->op = tmp_op;
                    node->data[0] = NULL;
                    node->data[1] = NULL;
                    if (end > start)
                        node->data[0] = bc_strndup(src + start, end - start);
                    if (end2 > start2) {
                        node->data[1] = bc_strndup(src + start2, end2 - start2);
                        start2 = 0;
                        end2 = 0;
                    }
                    if (type == BLOGC_TEMPLATE_NODE_BLOCK)
                        block_type = node->data[0];
                    ast = bc_slist_append(ast, node);
                    previous = node;
                    node = NULL;
                    state = TEMPLATE_START;
                    type = BLOGC_TEMPLATE_NODE_CONTENT;
                    start = current + 1;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src,
                    src_len, current,
                    "Invalid statement syntax. Must end with '}'.");
                break;

        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL) {
        if (state == TEMPLATE_BLOCK_IF_STRING_OPERAND)
            *err = bc_error_parser(BLOGC_ERROR_TEMPLATE_PARSER, src, src_len,
                start2, "Found an open double-quoted string.");
        else if (if_count != 0)
            *err = bc_error_new_printf(BLOGC_ERROR_TEMPLATE_PARSER,
                "%d open 'if', 'ifdef' and/or 'ifndef' statements were not closed!",
                if_count);
        else if (block_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open block was not closed!");
        else if (foreach_open)
            *err = bc_error_new(BLOGC_ERROR_TEMPLATE_PARSER,
                "An open 'foreach' statement was not closed!");
    }

    if (*err != NULL) {
        if (node != NULL) {
            free(node->data[0]);
            free(node);
        }
        blogc_template_free_ast(ast);
        return NULL;
    }

    return ast;
}